

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

int event_base_once(event_base *base,int fd,short events,_func_void_int_short_void_ptr *callback,
                   void *arg,timeval *tv)

{
  event_once *peVar1;
  bool bVar2;
  int iVar3;
  event_once *arg_00;
  
  iVar3 = -1;
  if ((events & 0x18U) != 0) {
    return -1;
  }
  arg_00 = (event_once *)event_mm_calloc_(1,0xa0);
  if (arg_00 == (event_once *)0x0) {
    return -1;
  }
  arg_00->cb = callback;
  arg_00->arg = arg;
  if ((events & 0x87U) == 1) {
    event_assign(&arg_00->ev,base,-1,0,event_once_cb,arg_00);
    if ((tv == (timeval *)0x0) || ((bVar2 = true, tv->tv_sec == 0 && (tv->tv_usec == 0)))) {
      bVar2 = false;
    }
  }
  else {
    if ((events & 0x86U) == 0) goto LAB_00250a97;
    event_assign(&arg_00->ev,base,fd,events & 0x86,event_once_cb,arg_00);
    bVar2 = true;
  }
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
  }
  if (bVar2) {
    iVar3 = event_add_nolock_(&arg_00->ev,tv,0);
  }
  else {
    event_active_nolock_(&arg_00->ev,1,1);
    iVar3 = 0;
  }
  if (iVar3 == 0) {
    peVar1 = (base->once_events).lh_first;
    (arg_00->next_once).le_next = peVar1;
    if (peVar1 != (event_once *)0x0) {
      (((base->once_events).lh_first)->next_once).le_prev = (event_once **)arg_00;
    }
    (base->once_events).lh_first = arg_00;
    (arg_00->next_once).le_prev = &(base->once_events).lh_first;
    if (base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
      return 0;
    }
    return 0;
  }
LAB_00250a97:
  if (mm_free_fn_ == (_func_void_void_ptr *)0x0) {
    free(arg_00);
  }
  else {
    (*mm_free_fn_)(arg_00);
  }
  return iVar3;
}

Assistant:

int
event_base_once(struct event_base *base, evutil_socket_t fd, short events,
    void (*callback)(evutil_socket_t, short, void *),
    void *arg, const struct timeval *tv)
{
	struct event_once *eonce;
	int res = 0;
	int activate = 0;

	/* We cannot support signals that just fire once, or persistent
	 * events. */
	if (events & (EV_SIGNAL|EV_PERSIST))
		return (-1);

	if ((eonce = mm_calloc(1, sizeof(struct event_once))) == NULL)
		return (-1);

	eonce->cb = callback;
	eonce->arg = arg;

	if ((events & (EV_TIMEOUT|EV_SIGNAL|EV_READ|EV_WRITE|EV_CLOSED)) == EV_TIMEOUT) {
		evtimer_assign(&eonce->ev, base, event_once_cb, eonce);

		if (tv == NULL || ! evutil_timerisset(tv)) {
			/* If the event is going to become active immediately,
			 * don't put it on the timeout queue.  This is one
			 * idiom for scheduling a callback, so let's make
			 * it fast (and order-preserving). */
			activate = 1;
		}
	} else if (events & (EV_READ|EV_WRITE|EV_CLOSED)) {
		events &= EV_READ|EV_WRITE|EV_CLOSED;

		event_assign(&eonce->ev, base, fd, events, event_once_cb, eonce);
	} else {
		/* Bad event combination */
		mm_free(eonce);
		return (-1);
	}

	if (res == 0) {
		EVBASE_ACQUIRE_LOCK(base, th_base_lock);
		if (activate)
			event_active_nolock_(&eonce->ev, EV_TIMEOUT, 1);
		else
			res = event_add_nolock_(&eonce->ev, tv, 0);

		if (res != 0) {
			mm_free(eonce);
			return (res);
		} else {
			LIST_INSERT_HEAD(&base->once_events, eonce, next_once);
		}
		EVBASE_RELEASE_LOCK(base, th_base_lock);
	}

	return (0);
}